

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O3

void __thiscall brown::MySimulator::hardwareLoop(MySimulator *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = this->ptIdx;
  if (uVar1 < 0x295) {
    iVar3 = (int)state[uVar1][1] / this->scale;
    iVar2 = (int)state[uVar1][2] / this->scale;
    moveLinear(this,iVar3 - this->locs[0],iVar2 - this->locs[1],state[uVar1][0] != 0);
    this->locs[0] = iVar3;
    this->locs[1] = iVar2;
    this->ptIdx = this->ptIdx + 1;
  }
  else {
    Simulator::setpin(&this->super_Simulator,this->clk,false,false,false,false,false);
  }
  return;
}

Assistant:

void MySimulator::hardwareLoop() {
    // drawing finished, do nothing
    static constexpr int ptNum = sizeof(state)/sizeof(state[0]);
    if (ptIdx >= ptNum) {
        setpin(clk, false, false, false, false, false);
        return;
    }

    // target location [px]
    int x = state[ptIdx][1]/scale;
    int y = state[ptIdx][2]/scale;
    bool isDown = static_cast<bool>(state[ptIdx][0]);

    // relative linear motion
    int dx = x - locs[0];
    int dy = y - locs[1];
    moveLinear(dx, dy, isDown);

    // update meta
    locs[0] = x; locs[1] = y;
    ptIdx++;
}